

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::ListSortFun::GetFunctions(void)

{
  long lVar1;
  undefined8 *puVar2;
  ScalarFunctionSet *in_RDI;
  undefined8 *puVar3;
  byte bVar4;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  ScalarFunctionSet *list_sort;
  ScalarFunction sort_orders;
  ScalarFunction sort_order;
  ScalarFunction sort;
  allocator_type local_8f9;
  ScalarFunctionSet *local_8f8;
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *local_8f0;
  code *local_8e8;
  allocator_type local_8e0 [24];
  code *local_8c8;
  undefined8 uStack_8c0;
  code *local_8b8;
  code *pcStack_8b0;
  code *local_8a8;
  undefined8 uStack_8a0;
  code *local_898;
  code *pcStack_890;
  code *local_888;
  undefined8 uStack_880;
  code *local_878;
  code *pcStack_870;
  _Any_data *local_860;
  allocator_type local_858 [24];
  LogicalType local_840 [24];
  LogicalType local_828 [24];
  LogicalType local_810 [24];
  LogicalType local_7f8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_7e0;
  LogicalType local_7c8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_7b0;
  LogicalType local_798 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_780;
  LogicalType local_768 [24];
  LogicalType local_750 [24];
  LogicalType local_738 [24];
  undefined1 local_720 [144];
  LogicalType aLStack_690 [32];
  _Any_data _Stack_670;
  _Manager_type local_660;
  undefined8 auStack_650 [9];
  element_type *local_608;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_600;
  undefined1 local_5f8 [176];
  _Any_data local_548;
  _Manager_type local_538;
  undefined8 auStack_528 [9];
  element_type *local_4e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4d8;
  undefined1 local_4d0 [176];
  _Any_data _Stack_420;
  _Manager_type local_410;
  undefined8 auStack_400 [9];
  element_type *local_3b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  undefined1 local_3a8 [176];
  _Any_data local_2f8;
  _Manager_type local_2e8;
  undefined8 auStack_2d8 [9];
  element_type *local_290;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_288;
  undefined1 local_280 [176];
  _Any_data _Stack_1d0;
  _Manager_type local_1c0;
  undefined8 auStack_1b0 [9];
  element_type *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  undefined1 local_158 [176];
  _Any_data _Stack_a8;
  _Manager_type local_98;
  undefined8 auStack_88 [9];
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar4 = 0;
  local_8f8 = in_RDI;
  duckdb::LogicalType::LogicalType((LogicalType *)local_720,ANY);
  duckdb::LogicalType::LIST((LogicalType *)local_280);
  __l._M_len = 1;
  __l._M_array = (iterator)local_280;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_780,__l,local_8e0);
  duckdb::LogicalType::LogicalType(local_840,ANY);
  duckdb::LogicalType::LIST(local_798);
  uStack_880 = 0;
  local_888 = ListSortFunction;
  pcStack_870 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_878 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_738,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_158,&local_780,local_798,&local_888,ListNormalSortBind,0,0,0,
             local_738,0,0,0);
  duckdb::LogicalType::~LogicalType(local_738);
  if (local_878 != (code *)0x0) {
    (*local_878)(&local_888,&local_888,3);
  }
  duckdb::LogicalType::~LogicalType(local_798);
  duckdb::LogicalType::~LogicalType(local_840);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_780);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_280);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_720);
  duckdb::LogicalType::LogicalType(local_840,ANY);
  duckdb::LogicalType::LIST((LogicalType *)local_720);
  duckdb::LogicalType::LogicalType((LogicalType *)(local_720 + 0x18),VARCHAR);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_720;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_7b0,__l_00,local_858);
  duckdb::LogicalType::LogicalType((LogicalType *)local_8e0,ANY);
  duckdb::LogicalType::LIST(local_7c8);
  uStack_8a0 = 0;
  local_8a8 = ListSortFunction;
  pcStack_890 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_898 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_750,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_280,&local_7b0,local_7c8,&local_8a8,ListNormalSortBind,0,0,0,
             local_750,0,0,0);
  duckdb::LogicalType::~LogicalType(local_750);
  if (local_898 != (code *)0x0) {
    (*local_898)(&local_8a8,&local_8a8,3);
  }
  duckdb::LogicalType::~LogicalType(local_7c8);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_8e0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_7b0);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType((LogicalType *)(local_720 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  duckdb::LogicalType::~LogicalType(local_840);
  duckdb::LogicalType::LogicalType((LogicalType *)local_8e0,ANY);
  duckdb::LogicalType::LIST(local_840);
  duckdb::LogicalType::LogicalType(local_828,VARCHAR);
  duckdb::LogicalType::LogicalType(local_810,VARCHAR);
  __l_01._M_len = 3;
  __l_01._M_array = local_840;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_7e0,__l_01,&local_8f9);
  duckdb::LogicalType::LogicalType((LogicalType *)local_858,ANY);
  duckdb::LogicalType::LIST(local_7f8);
  uStack_8c0 = 0;
  local_8c8 = ListSortFunction;
  pcStack_8b0 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_8b8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_768,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_720,&local_7e0,local_7f8,&local_8c8,ListNormalSortBind,0,0,0,
             local_768,0,0,0);
  duckdb::LogicalType::~LogicalType(local_768);
  if (local_8b8 != (code *)0x0) {
    (*local_8b8)(&local_8c8,&local_8c8,3);
  }
  duckdb::LogicalType::~LogicalType(local_7f8);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_858);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_7e0);
  lVar1 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType(local_840 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_8e0);
  duckdb::ScalarFunctionSet::ScalarFunctionSet(local_8f8);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_3a8,(SimpleFunction *)local_158);
  local_8e8 = duckdb::Value::DECIMAL;
  local_3a8._0_8_ = duckdb::Value::DECIMAL;
  duckdb::LogicalType::LogicalType
            ((LogicalType *)(local_3a8 + 0x90),(LogicalType *)(local_158 + 0x90));
  local_3a8._168_4_ = local_158._168_4_;
  local_3a8._0_8_ = &PTR__ScalarFunction_008984e0;
  local_860 = &_Stack_a8;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_2f8,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             local_860);
  puVar2 = auStack_88;
  puVar3 = auStack_2d8;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  local_290 = local_40;
  local_288._M_pi = local_38._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  local_8f0 = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
              (local_8f8 + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(local_8f0,(ScalarFunction *)local_3a8);
  local_3a8._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
  }
  if (local_2e8 != (_Manager_type)0x0) {
    (*local_2e8)(&local_2f8,&local_2f8,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3a8);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_4d0,(SimpleFunction *)local_280);
  local_4d0._0_8_ = local_8e8;
  duckdb::LogicalType::LogicalType
            ((LogicalType *)(local_4d0 + 0x90),(LogicalType *)(local_280 + 0x90));
  local_4d0._168_4_ = local_280._168_4_;
  local_4d0._0_8_ = &PTR__ScalarFunction_008984e0;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &_Stack_420,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &_Stack_1d0);
  puVar2 = auStack_1b0;
  puVar3 = auStack_400;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  local_3b8 = local_168;
  local_3b0._M_pi = local_160._M_pi;
  if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
    }
  }
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(local_8f0,(ScalarFunction *)local_4d0);
  local_4d0._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0._M_pi);
  }
  if (local_410 != (_Manager_type)0x0) {
    (*local_410)(&_Stack_420,&_Stack_420,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_4d0);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_5f8,(SimpleFunction *)local_720);
  local_5f8._0_8_ = local_8e8;
  duckdb::LogicalType::LogicalType((LogicalType *)(local_5f8 + 0x90),aLStack_690);
  local_5f8[0xa8] = aLStack_690[0x18];
  local_5f8[0xa9] = aLStack_690[0x19];
  local_5f8[0xaa] = aLStack_690[0x1a];
  local_5f8[0xab] = aLStack_690[0x1b];
  local_5f8._0_8_ = &PTR__ScalarFunction_008984e0;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_548,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &_Stack_670);
  puVar2 = auStack_650;
  puVar3 = auStack_528;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  local_4e0 = local_608;
  local_4d8._M_pi = local_600._M_pi;
  if (local_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_600._M_pi)->_M_use_count = (local_600._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_600._M_pi)->_M_use_count = (local_600._M_pi)->_M_use_count + 1;
    }
  }
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(local_8f0,(ScalarFunction *)local_5f8);
  local_5f8._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_4d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4d8._M_pi);
  }
  if (local_538 != (_Manager_type)0x0) {
    (*local_538)(&local_548,&local_548,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_5f8);
  local_720._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_600._M_pi);
  }
  if (local_660 != (_Manager_type)0x0) {
    (*local_660)(&_Stack_670,&_Stack_670,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_720);
  local_280._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
  }
  if (local_1c0 != (_Manager_type)0x0) {
    (*local_1c0)(&_Stack_1d0,&_Stack_1d0,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_280);
  local_158._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_98 != (_Manager_type)0x0) {
    (*local_98)(local_860,local_860,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_158);
  return local_8f8;
}

Assistant:

ScalarFunctionSet ListSortFun::GetFunctions() {
	// one parameter: list
	ScalarFunction sort({LogicalType::LIST(LogicalType::ANY)}, LogicalType::LIST(LogicalType::ANY), ListSortFunction,
	                    ListNormalSortBind);

	// two parameters: list, order
	ScalarFunction sort_order({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR},
	                          LogicalType::LIST(LogicalType::ANY), ListSortFunction, ListNormalSortBind);

	// three parameters: list, order, null order
	ScalarFunction sort_orders({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR, LogicalType::VARCHAR},
	                           LogicalType::LIST(LogicalType::ANY), ListSortFunction, ListNormalSortBind);

	ScalarFunctionSet list_sort;
	list_sort.AddFunction(sort);
	list_sort.AddFunction(sort_order);
	list_sort.AddFunction(sort_orders);
	return list_sort;
}